

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

longlong nullcGetResultLong(void)

{
  longlong lVar1;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  else {
    if (NULLC::currExec == 0) {
      lVar1 = ExecutorRegVm::GetResultLong(NULLC::executorRegVm);
      return lVar1;
    }
    if (NULLC::currExec == 1) {
      lVar1 = ExecutorX86::GetResultLong(NULLC::executorX86);
      return lVar1;
    }
  }
  return 0;
}

Assistant:

long long nullcGetResultLong()
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(0);

#ifdef NULLC_BUILD_X86_JIT
	if(currExec == NULLC_X86)
		return executorX86->GetResultLong();
#endif
#if defined(NULLC_LLVM_SUPPORT) && !defined(NULLC_NO_EXECUTOR)
	if(currExec == NULLC_LLVM)
		return executorLLVM->GetResultLong();
#endif
#ifndef NULLC_NO_EXECUTOR
	if(currExec == NULLC_REG_VM)
		return executorRegVm->GetResultLong();
#endif

	return 0;
}